

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBytes::ByteSizeLong
          (TensorValue_RepeatedBytes *this)

{
  bool bVar1;
  int size;
  ulong uVar2;
  string *value;
  long lVar3;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  TensorValue_RepeatedBytes *this_local;
  
  _cached_size = 0;
  _internal_values_abi_cxx11_(this);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    value = _internal_values_abi_cxx11_(this);
    _cached_size = google::protobuf::internal::WireFormatLite::BytesSize(value);
    _cached_size = _cached_size + 1;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar3 = std::__cxx11::string::size();
    _cached_size = lVar3 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t TensorValue_RepeatedBytes::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.TensorValue.RepeatedBytes)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // bytes values = 1;
  if (!this->_internal_values().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
        this->_internal_values());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}